

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.cpp
# Opt level: O2

void __thiscall
TPZCompElH1<pzshape::TPZShapePrism>::SetSideOrder
          (TPZCompElH1<pzshape::TPZShapePrism> *this,int side,int order)

{
  int64_t iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ostream *poVar5;
  long lVar6;
  TPZConnect *this_00;
  long *plVar7;
  TPZCompMesh *pTVar8;
  TPZGeoElSide gelside;
  TPZStack<TPZCompElSide,_10> equal;
  
  if (((uint)side < 0x15) && (0 < order || (uint)side < 6)) {
    if ((5 < (uint)side) && ((this->fConnectIndexes).super_TPZVec<long>.fStore[side] != -1)) {
      iVar2 = (this->super_TPZIntelGen<pzshape::TPZShapePrism>).super_TPZInterpolatedElement.
              super_TPZInterpolationSpace.fPreferredOrder;
      lVar6 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 0xa0))(this,0x14);
      if (lVar6 != -1) {
        iVar2 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                       super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                       super_TPZCompEl + 0x338))(this,0x14);
      }
      this_00 = (TPZConnect *)
                (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                       super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                       super_TPZCompEl + 0xa8))(this,side);
      if ((uint)(this_00->field_2).fCompose.fOrder != order) {
        (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                               super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                               super_TPZCompEl + 0xa0))(this,side);
        (this_00->field_2).fCompose.fOrder = (uchar)order;
        iVar1 = this_00->fSequenceNumber;
        plVar7 = (long *)(**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                                super_TPZInterpolatedElement.
                                                super_TPZInterpolationSpace.super_TPZCompEl + 0xb8))
                                   (this);
        if (plVar7 == (long *)0x0) {
          iVar3 = 1;
        }
        else {
          iVar3 = (**(code **)(*plVar7 + 0x78))(plVar7);
        }
        uVar4 = pzshape::TPZShapePrism::NConnectShapeF(side,order);
        this_00->fNShape = uVar4;
        TPZConnect::SetNState(this_00,iVar3);
        pTVar8 = TPZCompEl::Mesh((TPZCompEl *)this);
        TPZBlock::Set(&pTVar8->fBlock,(int)iVar1,uVar4 * iVar3,-1);
        gelside.fGeoEl = TPZCompEl::Reference((TPZCompEl *)this);
        gelside.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
        gelside.fSide = side;
        TPZStack<TPZCompElSide,_10>::TPZStack(&equal);
        TPZGeoElSide::EqualLevelCompElementList(&gelside,&equal,1,0);
        lVar6 = 0;
        if (equal.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNElements < 1)
        {
          equal.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNElements = lVar6
          ;
        }
        while (equal.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNElements !=
               0) {
          plVar7 = (long *)__dynamic_cast(*(undefined8 *)
                                           ((long)&(equal.super_TPZManVector<TPZCompElSide,_10>.
                                                    super_TPZVec<TPZCompElSide>.fStore)->fEl + lVar6
                                           ),&TPZCompEl::typeinfo,&TPZInterpolatedElement::typeinfo,
                                          0);
          (**(code **)(*plVar7 + 0x270))(plVar7);
          lVar6 = lVar6 + 0x10;
          equal.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNElements =
               equal.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNElements +
               -1;
        }
        TPZManVector<TPZCompElSide,_10>::~TPZManVector(&equal.super_TPZManVector<TPZCompElSide,_10>)
        ;
      }
      lVar6 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 0xa0))(this,0x14);
      if ((lVar6 != -1) &&
         (iVar3 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                         super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                         super_TPZCompEl + 0x338))(this,0x14), iVar3 != iVar2)) {
        (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                               super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                               super_TPZCompEl + 0x270))(this);
      }
    }
    return;
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"TPZIntelGen::SetSideOrder. Bad paramenter side ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,side);
  poVar5 = std::operator<<(poVar5," order ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,order);
  std::endl<char,std::char_traits<char>>(poVar5);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZCompElH1.cpp"
             ,0xa8);
}

Assistant:

void TPZCompElH1<TSHAPE>::SetSideOrder(int side, int order) {
	if(side<0 || side >= TSHAPE::NSides || (side >= TSHAPE::NCornerNodes && order <1)) {
		PZError << "TPZIntelGen::SetSideOrder. Bad paramenter side " << side << " order " << order << std::endl;
		DebugStop();
#ifdef PZ_LOG
		std::stringstream sout;
		sout << __PRETTY_FUNCTION__ << " Bad side or order " << side << " order " << order;
		LOGPZ_ERROR(logger,sout.str())
#endif
		return;
	}
	if(side>= TSHAPE::NCornerNodes) {
		if(fConnectIndexes[side] == -1) return;
        int prevorder = this->fPreferredOrder;
        if (this->ConnectIndex(TSHAPE::NSides-1) != -1) {
            prevorder = EffectiveSideOrder(TSHAPE::NSides-1);
        }
		TPZConnect &c = this->Connect(side);
        int previousconnectorder = c.Order();
        if (order != previousconnectorder)
        {
            c.SetOrder(order,this->ConnectIndex(side));
            int64_t seqnum = c.SequenceNumber();
            int nvar = 1;
            TPZMaterial * mat = this->Material();
            if(mat) nvar = mat->NStateVariables();
            int nshape = TSHAPE::NConnectShapeF(side, order);
            c.SetNShape(nshape);
            c.SetNState(nvar);
            this->Mesh()->Block().Set(seqnum,nshape*nvar);
            TPZGeoElSide gelside(this->Reference(),side);
            TPZStack<TPZCompElSide> equal;
            gelside.EqualLevelCompElementList(equal, 1, 0);
            int64_t neq = equal.size();
            for (int64_t eq=0; eq<neq; eq++) {
                TPZInterpolatedElement *intel = dynamic_cast<TPZInterpolatedElement*>(equal[eq].Element());
                intel->AdjustIntegrationRule();
            }
        }
        
        int neworder = prevorder;
        if (this->ConnectIndex(TSHAPE::NSides-1) != -1) {
            neworder = EffectiveSideOrder(TSHAPE::NSides-1);
        }
		if(neworder != prevorder) {
            this->AdjustIntegrationRule();
		}
	}
}